

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNsPtr xmlNewReconciledNs(xmlDocPtr doc,xmlNodePtr tree,xmlNsPtr ns)

{
  int local_6c;
  xmlChar local_68 [4];
  int counter;
  xmlChar prefix [50];
  xmlNsPtr def;
  xmlNsPtr ns_local;
  xmlNodePtr tree_local;
  xmlDocPtr doc_local;
  
  local_6c = 1;
  if ((tree == (xmlNodePtr)0x0) || (tree->type != XML_ELEMENT_NODE)) {
    doc_local = (xmlDocPtr)0x0;
  }
  else if ((ns == (xmlNsPtr)0x0) || (ns->type != XML_NAMESPACE_DECL)) {
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    register0x00000000 = (xmlDocPtr)xmlSearchNsByHref(doc,tree,ns->href);
    doc_local = register0x00000000;
    if (register0x00000000 == (xmlDocPtr)0x0) {
      if (ns->prefix == (xmlChar *)0x0) {
        snprintf((char *)local_68,0x32,"default");
      }
      else {
        snprintf((char *)local_68,0x32,"%.20s",ns->prefix);
      }
      register0x00000000 = (xmlDocPtr)xmlSearchNs(doc,tree,local_68);
      while (stack0xffffffffffffffd0 != (xmlDocPtr)0x0) {
        if (1000 < local_6c) {
          return (xmlNsPtr)0x0;
        }
        if (ns->prefix == (xmlChar *)0x0) {
          snprintf((char *)local_68,0x32,"default%d");
        }
        else {
          snprintf((char *)local_68,0x32,"%.20s%d",ns->prefix);
        }
        local_6c = local_6c + 1;
        register0x00000000 = (xmlDocPtr)xmlSearchNs(doc,tree,local_68);
      }
      doc_local = (xmlDocPtr)xmlNewNs(tree,ns->href,local_68);
    }
  }
  return (xmlNsPtr)doc_local;
}

Assistant:

static xmlNsPtr
xmlNewReconciledNs(xmlDocPtr doc, xmlNodePtr tree, xmlNsPtr ns) {
    xmlNsPtr def;
    xmlChar prefix[50];
    int counter = 1;

    if ((tree == NULL) || (tree->type != XML_ELEMENT_NODE)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNewReconciledNs : tree == NULL\n");
#endif
	return(NULL);
    }
    if ((ns == NULL) || (ns->type != XML_NAMESPACE_DECL)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNewReconciledNs : ns == NULL\n");
#endif
	return(NULL);
    }
    /*
     * Search an existing namespace definition inherited.
     */
    def = xmlSearchNsByHref(doc, tree, ns->href);
    if (def != NULL)
        return(def);

    /*
     * Find a close prefix which is not already in use.
     * Let's strip namespace prefixes longer than 20 chars !
     */
    if (ns->prefix == NULL)
	snprintf((char *) prefix, sizeof(prefix), "default");
    else
	snprintf((char *) prefix, sizeof(prefix), "%.20s", (char *)ns->prefix);

    def = xmlSearchNs(doc, tree, prefix);
    while (def != NULL) {
        if (counter > 1000) return(NULL);
	if (ns->prefix == NULL)
	    snprintf((char *) prefix, sizeof(prefix), "default%d", counter++);
	else
	    snprintf((char *) prefix, sizeof(prefix), "%.20s%d",
		(char *)ns->prefix, counter++);
	def = xmlSearchNs(doc, tree, prefix);
    }

    /*
     * OK, now we are ready to create a new one.
     */
    def = xmlNewNs(tree, ns->href, prefix);
    return(def);
}